

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_CorrectModifiersForAutoEscape::Test_Template_CorrectModifiersForAutoEscape
          (Test_Template_CorrectModifiersForAutoEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, CorrectModifiersForAutoEscape) {
  string text, expected_out;

  // template with no variable, nothing to emit.
  text = "Static template.";
  AssertCorrectModifiers(TC_HTML, text, "");

  // Simple templates with one variable substitution.

  // 1. No in-template modifiers. Auto Escaper sets correct ones.
  text = "Hello {{USER}}";
  AssertCorrectModifiers(TC_HTML, text, "USER:h\n");

  // Complete URLs in different attributes that take URLs.
  text = "<a href=\"{{URL}}\">bla</a>";
  AssertCorrectModifiers(TC_HTML, text, "URL:U=html\n");
  text = "<script src=\"{{URL}}\"></script>";
  AssertCorrectModifiers(TC_HTML, text, "URL:U=html\n");
  text = "<img src=\"{{URL}}\">";
  AssertCorrectModifiers(TC_HTML, text, "URL:U=html\n");
  // URL fragment only so just html_escape.
  text = "<img src=\"/bla?q={{QUERY}}\">";
  AssertCorrectModifiers(TC_HTML, text, "QUERY:h\n");
  // URL fragment not quoted, so url_escape.
  text = "<img src=/bla?q={{QUERY}}>";
  AssertCorrectModifiers(TC_HTML, text, "QUERY:u\n");

  text = "<br class=\"{{CLASS}}\">";
  AssertCorrectModifiers(TC_HTML, text, "CLASS:h\n");
  text = "<br class={{CLASS}}>";
  AssertCorrectModifiers(TC_HTML, text, "CLASS:H=attribute\n");
  text = "<br {{CLASS}}>";   // CLASS here is name/value pair.
  AssertCorrectModifiers(TC_HTML, text, "CLASS:H=attribute\n");
  text = "<br style=\"display:{{DISPLAY}}\">";   // Style attribute.
  AssertCorrectModifiers(TC_HTML, text, "DISPLAY:c\n");

  // Content inside a style tag should have :c regardless of quoting.
  text = "<style>color:{{COLOR}}; font:\"{{FONT}}\"</style>";
  AssertCorrectModifiers(TC_HTML, text, "COLOR:c\nFONT:c\n");

  // onMouseEvent and onKeyUp accept javascript.
  text = "<a href=\"url\" onkeyup=\"doX('{{ID}}');\">";  // ID quoted
  AssertCorrectModifiers(TC_HTML, text, "ID:j\n");
  text = "<a href=\"url\" onclick=\"doX({{ID}});\">";    // ID not quoted
  AssertCorrectModifiers(TC_HTML, text, "ID:J=number\n");
  text = "<a href=\"url\" onclick=\"'{{ID}}'\">";        // not common
  AssertCorrectModifiers(TC_HTML, text, "ID:j\n");
  // If ID is javascript code, J=number  will break it, for good and bad.
  text = "<a href=\"url\" onclick=\"{{ID}}\">";
  AssertCorrectModifiers(TC_HTML, text, "ID:J=number\n");

  // Target just needs html escaping.
  text = "<a href=\"url\" target=\"{{TARGET}}\">";
  AssertCorrectModifiers(TC_HTML, text, "TARGET:h\n");

  // Test a parsing corner case which uses TemplateDirective
  // call in the parser to change state properly. To reproduce
  // both variables should be unquoted and the first should
  // have no value except the variable substitution.
  text = "<img class={{CLASS}} src=/bla?q={{QUERY}}>";
  AssertCorrectModifiers(TC_HTML, text, "CLASS:H=attribute\nQUERY:u\n");

  // TODO(jad): Once we have a fix for it in code, fix me.
  // Javascript URL is not properly supported, we currently
  // apply :h which is not sufficient.
  text = "<a href=\"javascript:foo('{{VAR}}')>bla</a>";
  AssertCorrectModifiers(TC_HTML, text, "VAR:h\n");

  // Special handling for BI_SPACE and BI_NEWLINE.
  text = "{{BI_SPACE}}";
  AssertCorrectModifiers(TC_HTML, text, "BI_SPACE\n");      // Untouched.
  text = "{{BI_NEWLINE}}";
  AssertCorrectModifiers(TC_HTML, text, "BI_NEWLINE\n");    // Untouched.
  // Check that the parser is parsing BI_SPACE, if not, it would have failed.
  text = "<a href=/bla{{BI_SPACE}}style=\"{{VAR}}\">text</a>";
  AssertCorrectModifiers(TC_HTML, text, "BI_SPACE\nVAR:c\n");


  // XML and JSON modes.
  text = "<PARAM name=\"{{VAL}}\">{{DATA}}";
  AssertCorrectModifiers(TC_XML, text, "VAL:xml_escape\nDATA:xml_escape\n");
  text = "{ x = \"{{VAL}}\"}";
  AssertCorrectModifiers(TC_JSON, text, "VAL:j\n");

  // 2. Escaping modifiers were set, handle them.

  // 2a: Modifier :none is honored whether the escaping is correct or not.
  text = "Hello {{USER:none}}";                   // :none on its own.
  AssertCorrectModifiers(TC_HTML, text, "USER:none\n");
  text = "Hello {{USER:h:none}}";                 // correct escaping.
  AssertCorrectModifiers(TC_HTML, text, "USER:h:none\n");
  text = "Hello {{USER:j:none}}";                 // incorrect escaping.
  AssertCorrectModifiers(TC_HTML, text, "USER:j:none\n");
  text = "<a href=\"url\" onkeyup=\"doX('{{ID:none}}');\">";
  AssertCorrectModifiers(TC_HTML, text, "ID:none\n");

  // 2b: Correct modifiers, nothing to change.
  text = "Hello {{USER:h}}";
  AssertCorrectModifiers(TC_HTML, text, "USER:h\n");
  text = "Hello {{USER:U=html}}";  // :U=html is a valid replacement for .h
  AssertCorrectModifiers(TC_HTML, text, "USER:U=html\n");
  text = "Hello {{USER:H=url}}";   // :H=url (a.k.a. U=html) is valid too
  AssertCorrectModifiers(TC_HTML, text, "USER:H=url\n");
  text = "Hello {{USER:h:j}}";   // Extra :j, honor it.
  AssertCorrectModifiers(TC_HTML, text, "USER:h:j\n");
  text = "<a href=\"{{URL:U=html}}\">bla</a>";
  AssertCorrectModifiers(TC_HTML, text, "URL:U=html\n");
  text = "<a href=\"/bla?q={{QUERY:h}}\">bla</a>";  // :h is valid.
  AssertCorrectModifiers(TC_HTML, text, "QUERY:h\n");
  text = "<a href=\"/bla?q={{QUERY:u}}\">bla</a>";  // so is :u.
  AssertCorrectModifiers(TC_HTML, text, "QUERY:u\n");
  text = "<a href=\"url\" onclick=\"doX('{{ID:j}}');\">";
  AssertCorrectModifiers(TC_HTML, text, "ID:j\n");
  text = "<a href=\"url\" onclick=\"doX({{ID:J=number}});\">";
  AssertCorrectModifiers(TC_HTML, text, "ID:J=number\n");
  text = "<style>@import url(\"{{URL:U=css}}\")</style>";  // correct :U=css
  AssertCorrectModifiers(TC_HTML, text, "URL:U=css\n");

  // 2c: Incorrect modifiers, add our own.
  text = "Hello {{USER:j}}";                          // Missing :h
  AssertCorrectModifiers(TC_HTML, text, "USER:j:h\n");
  text = "Hello {{USER:c:c:c:c:c:j}}";                // Still missing :h
  AssertCorrectModifiers(TC_HTML, text, "USER:c:c:c:c:c:j:h\n");
  text = "<script>var a = \"{{VAR:h}}\";</script>";   // Missing :j
  AssertCorrectModifiers(TC_HTML, text, "VAR:h:j\n");
  text = "<script>var a = \"{{VAR:j:h:j}}\";</script>";   // Extra :h:j
  AssertCorrectModifiers(TC_HTML, text, "VAR:j:h:j\n");
  text = "<a href=\"url\" onclick=\"doX({{ID:j}});\">";   // Unquoted
  AssertCorrectModifiers(TC_HTML, text, "ID:j:J=number\n");

  // 2d: Custom modifiers are maintained.
  text = "Hello {{USER:x-bla}}";                  // Missing :h
  AssertCorrectModifiers(TC_HTML, text, "USER:x-bla:h\n");
  text = "Hello {{USER:x-bla:h}}";                // Correct, accept it.
  AssertCorrectModifiers(TC_HTML, text, "USER:x-bla:h\n");
  text = "Hello {{USER:x-bla:x-foo}}";            // Missing :h
  AssertCorrectModifiers(TC_HTML, text, "USER:x-bla:x-foo:h\n");
  text = "Hello {{USER:x-bla:none}}";             // Complete due to :none
  AssertCorrectModifiers(TC_HTML, text, "USER:x-bla:none\n");
  text = "Hello {{USER:h:x-bla}}";                // Still missing :h.
  AssertCorrectModifiers(TC_HTML, text, "USER:h:x-bla:h\n");
  text = "Hello {{USER:x-bla:h:x-foo}}";          // Still missing :h
  AssertCorrectModifiers(TC_HTML, text, "USER:x-bla:h:x-foo:h\n");
  text = "Hello {{USER:x-bla:h:x-foo:h}}";        // Valid, accept it.
  AssertCorrectModifiers(TC_HTML, text, "USER:x-bla:h:x-foo:h\n");

  // 2e: Equivalent modifiers are honored. All HTML Escapes.
  text = "Hello {{USER:p}}";
  AssertCorrectModifiers(TC_HTML, text, "USER:p\n");
  text = "Hello {{USER:H=attribute}}";
  AssertCorrectModifiers(TC_HTML, text, "USER:H=attribute\n");
  text = "Hello {{USER:H=snippet}}";
  AssertCorrectModifiers(TC_HTML, text, "USER:H=snippet\n");
  text = "Hello {{USER:H=pre}}";
  AssertCorrectModifiers(TC_HTML, text, "USER:H=pre\n");
  // All URL + HTML Escapes.
  text = "<a href=\"{{URL:H=url}}\">bla</a>";
  AssertCorrectModifiers(TC_HTML, text, "URL:H=url\n");
  text = "<a href=\"{{URL:U=html}}\">bla</a>";
  AssertCorrectModifiers(TC_HTML, text, "URL:U=html\n");

  // 2f: Initialize template in Javascript Context.
  text = "var a = '{{VAR}}'";                     // Escaping not given.
  AssertCorrectModifiers(TC_JS, text, "VAR:j\n");
  text = "var a = '{{VAR:none}}'";                // Variable safe.
  AssertCorrectModifiers(TC_JS, text, "VAR:none\n");
  text = "var a = '{{VAR:j}}'";                   // Escaping correct.
  AssertCorrectModifiers(TC_JS, text, "VAR:j\n");
  text = "var a = '{{VAR:h}}'";                   // Escaping incorrect.
  AssertCorrectModifiers(TC_JS, text, "VAR:h:j\n");
  text = "var a = '{{VAR:J=number}}'";            // Not considered equiv.
  AssertCorrectModifiers(TC_JS, text, "VAR:J=number:j\n");

  // 2g: Honor any modifiers for BI_SPACE and BI_NEWLINE.
  text = "{{BI_NEWLINE:j}}";     // An invalid modifier for the context.
  AssertCorrectModifiers(TC_HTML, text, "BI_NEWLINE:j\n");
  text = "{{BI_SPACE:h}}";       // An otherwise valid modifier.
  AssertCorrectModifiers(TC_HTML, text, "BI_SPACE:h\n");
  text = "{{BI_SPACE:x-bla}}";   // Also support custom modifiers.
  AssertCorrectModifiers(TC_HTML, text, "BI_SPACE:x-bla\n");

  // 2h: TC_CSS, TC_XML and TC_JSON
  text = "H1{margin-{{START_EDGE}}:0;\n text-align:{{END_EDGE}}\n}";
  AssertCorrectModifiers(TC_CSS, text, "START_EDGE:c\nEND_EDGE:c\n");
  text = "body{background:url('{{URL:U=css}}')}";  // :U=css valid substitute
  AssertCorrectModifiers(TC_CSS, text, "URL:U=css\n");
  text = "body{background:url('{{URL:U=html}}')}";  // Not valid, will add :c.
  AssertCorrectModifiers(TC_CSS, text, "URL:U=html:c\n");
  text = "<PARAM name=\"{{VAL:xml_escape}}\">";   // Correct escaping
  AssertCorrectModifiers(TC_XML, text, "VAL:xml_escape\n");
  text = "<PARAM name=\"{{VAL:H=attribute}}\">";   // XSS equivalent
  AssertCorrectModifiers(TC_XML, text, "VAL:H=attribute\n");
  text = "<PARAM name=\"{{VAL:h}}\">";   // XSS equivalent
  AssertCorrectModifiers(TC_XML, text, "VAL:h\n");
  text = "<PARAM name=\"{{VAL:H=pre}}\">";   // Not XSS equivalent
  AssertCorrectModifiers(TC_XML, text, "VAL:H=pre:xml_escape\n");
  text = "<PARAM name=\"{{VAL:c}}\">";   // Not XSS equivalent
  AssertCorrectModifiers(TC_XML, text, "VAL:c:xml_escape\n");
  text = "{user={{USER:j}}";   // Correct escaping
  AssertCorrectModifiers(TC_JSON, text, "USER:j\n");
  text = "{user={{USER:o}}";   // json_escape is XSS equivalent
  AssertCorrectModifiers(TC_JSON, text, "USER:o\n");
  text = "{user={{USER:h}}";   // but html_escape is not
  AssertCorrectModifiers(TC_JSON, text, "USER:h:j\n");

  // 2i: Variables with XssSafe Custom modifiers are untouched.
  ASSERT(GOOGLE_NAMESPACE::AddXssSafeModifier("x-test-cm",
                                       &GOOGLE_NAMESPACE::html_escape));
  text = "Hello {{USER:x-test-cm}}";              // Missing :h
  AssertCorrectModifiers(TC_HTML, text, "USER:x-test-cm\n");
  text = "Hello {{USER:x-test-cm:j}}";            // Extra :j
  AssertCorrectModifiers(TC_HTML, text, "USER:x-test-cm:j\n");
  text = "Hello {{USER:x-test-cm:x-foo}}";        // Non-safe modifier
  AssertCorrectModifiers(TC_HTML, text, "USER:x-test-cm:x-foo\n");
  text = "Hello {{USER:x-foo:x-test-cm}}";        // Non-safe modifier
  AssertCorrectModifiers(TC_HTML, text, "USER:x-foo:x-test-cm\n");
  text = "Hello {{USER:x-test-cm:none}}";         // Complete due to :none
  AssertCorrectModifiers(TC_HTML, text, "USER:x-test-cm:none\n");
  text = "Hello {{USER:h:x-test-cm}}";            // Prior escaping
  AssertCorrectModifiers(TC_HTML, text, "USER:h:x-test-cm\n");

  // 3. Larger test with close to every escaping case.

  text = "<html><head>\n"
      "<style>\n"
      "@import url(\"{{CSS_URL:U=css}}\");\n"
      "color:{{COLOR}}</style></head><body>\n"
      "<h1>{{TITLE}}</h1>\n"
      "<img src=\"{{IMG_URL}}\">\n"
      "<form action=\"/search\">\n"
      "  <input name=\"hl\" value={{HL}}>\n"
      "  <input name=\"m\" value=\"{{FORM_MSG}}\">\n"
      "</form>\n"
      "<div style=\"background:{{BG_COLOR}}\">\n"
      "</div>\n"
      "<script>\n"
      "  var msg_text = '{{MSG_TEXT}}';\n"
      "</script>\n"
      "<a href=\"url\" onmouseover=\"'{{MOUSE}}'\">bla</a>\n"
      "Goodbye friend {{USER}}!\n</body></html>\n";
  expected_out = "CSS_URL:U=css\n"
      "COLOR:c\n"
      "TITLE:h\n"
      "IMG_URL:U=html\n"
      "HL:H=attribute\n"
      "FORM_MSG:h\n"
      "BG_COLOR:c\n"
      "MSG_TEXT:j\n"
      "MOUSE:j\n"   // :j also escapes html entities
      "USER:h\n";
  AssertCorrectModifiers(TC_HTML, text, expected_out);
}